

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

void __thiscall duckdb_snappy::SnappyIOVecReader::Skip(SnappyIOVecReader *this,size_t n)

{
  ulong uVar1;
  
  while ((uVar1 = this->curr_size_remaining_, n != 0 && (uVar1 <= n))) {
    Advance(this);
    n = n - uVar1;
  }
  this->curr_size_remaining_ = uVar1 - n;
  this->total_size_remaining_ = this->total_size_remaining_ - n;
  this->curr_pos_ = this->curr_pos_ + n;
  return;
}

Assistant:

void Skip(size_t n) override {
    while (n >= curr_size_remaining_ && n > 0) {
      n -= curr_size_remaining_;
      Advance();
    }
    curr_size_remaining_ -= n;
    total_size_remaining_ -= n;
    curr_pos_ += n;
  }